

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command_User.cpp
# Opt level: O0

void __thiscall
userClass::changePassword(userClass *this,string *userID,string *newPass,string *oldPass)

{
  __type _Var1;
  bool bVar2;
  _Ios_Openmode _Var3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string *in_RSI;
  long in_RDI;
  string password_origin;
  fstream file;
  vector<int,_std::allocator<int>_> index;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  fpos<__mbstate_t> *in_stack_fffffffffffffd00;
  string *this_00;
  undefined4 in_stack_fffffffffffffd08;
  string local_2c8 [32];
  string local_2a8 [32];
  undefined8 local_288;
  undefined8 local_280;
  char local_278 [476];
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  dataClass *in_stack_ffffffffffffff70;
  string local_58 [32];
  string local_38 [23];
  char in_stack_ffffffffffffffdf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  
  arg = in_RCX;
  this_01 = in_RDX;
  std::__cxx11::string::string(local_58,in_RSI);
  unrolledLinkedListClass::readIndexData
            ((unrolledLinkedListClass *)this_01,arg,in_stack_ffffffffffffffdf);
  std::__cxx11::string::~string(local_58);
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(local_58 + 0x20));
  if (sVar4 == 1) {
    std::fstream::fstream(local_278);
    _Var3 = std::operator|(_S_in,_S_bin);
    std::fstream::open(local_278,0x11c088);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(local_58 + 0x20),0);
    std::fpos<__mbstate_t>::fpos
              (in_stack_fffffffffffffd00,
               CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    std::istream::seekg(local_278,local_288,local_280);
    this_00 = local_2a8;
    std::__cxx11::string::string(this_00);
    read_string((fstream *)in_RSI,(string *)CONCAT44(_Var3,in_stack_fffffffffffffd08),
                (int)((ulong)this_00 >> 0x20));
    _Var1 = std::operator==(in_RCX,in_RDX);
    if ((_Var1) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this_00,(char *)CONCAT17(in_stack_fffffffffffffcff,
                                                          in_stack_fffffffffffffcf8)), bVar2)) {
      std::__cxx11::string::string(local_2c8,(string *)in_RDX);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(local_58 + 0x20),0);
      dataClass::changeUserData
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      std::__cxx11::string::~string(local_2c8);
      _Var1 = std::operator==(in_RCX,in_RDX);
      if (_Var1) {
        std::__cxx11::string::operator=((string *)(in_RDI + 0x40),(string *)in_RDX);
      }
    }
    else {
      success = '0';
      puts("Invalid");
    }
    std::fstream::close();
    std::__cxx11::string::~string(local_2a8);
    std::fstream::~fstream(local_278);
  }
  else {
    success = '0';
    puts("Invalid");
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RSI);
  return;
}

Assistant:

void userClass::changePassword(string userID, string newPass, string oldPass) {
	vector<int> index = Userid.readIndexData(userID, '0');
	if (index.size() != 1) {ERROR; return ;}
	fstream file;
	file.open("Data_User.dat", ios::in | ios::binary);
	file.seekg(index[0] * 91 + 61);
	string password_origin;
	read_string(file, password_origin, 30);
	if (oldPass == password_origin || oldPass == "#"){
		data_manager.changeUserData(newPass, index[0]);
		if (this->userID == userID) this->password = newPass;
	} else ERROR;
	file.close();
}